

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O0

uchar * BUFFER_u_char(BUFFER_HANDLE handle)

{
  uchar *local_20;
  uchar *result;
  BUFFER *handleData;
  BUFFER_HANDLE handle_local;
  
  if ((handle == (BUFFER_HANDLE)0x0) || (handle->size == 0)) {
    local_20 = (uchar *)0x0;
  }
  else {
    local_20 = handle->buffer;
  }
  return local_20;
}

Assistant:

unsigned char* BUFFER_u_char(BUFFER_HANDLE handle)
{
    BUFFER* handleData = (BUFFER*)handle;
    unsigned char* result;
    if (handle == NULL || handleData->size == 0)
    {
        /* Codes_SRS_BUFFER_07_026: [BUFFER_u_char shall return NULL for any error that is encountered.] */
        /* Codes_SRS_BUFFER_07_029: [BUFFER_u_char shall return NULL if underlying buffer size is zero.] */
        result = NULL;
    }
    else
    {
        result = handleData->buffer;
    }
    return result;
}